

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::toupper(CBString *this,int __c)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = this;
  iVar1 = btoupper(&this->super_tagbstring);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"CBString::Failure in toupper",&local_59);
    CBStringException::CBStringException((CBStringException *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_38);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return -1;
}

Assistant:

void CBString::toupper () {
	if (BSTR_ERR == btoupper ((bstring) this)) {
		bstringThrow ("Failure in toupper");
	}
}